

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_permute_cols(m2v *M,int *colperm)

{
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  ulong uVar4;
  undefined8 uStack_80;
  undefined1 auStack_78 [12];
  int local_6c;
  undefined1 *local_68;
  int aiStack_60 [3];
  int e_next;
  int e;
  int i_1;
  m2v colbuf_mat;
  unsigned_long __vla_expr1;
  int i;
  unsigned_long __vla_expr0;
  int *colperm_local;
  m2v *M_local;
  
  lVar1 = -((ulong)(uint)M->n_col + 0xf & 0xfffffffffffffff0);
  puVar3 = auStack_78 + lVar1;
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ < M->n_col;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    puVar3[__vla_expr1._4_4_] = 0;
  }
  local_6c = M->n_row;
  local_68 = puVar3;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x102337;
  iVar2 = m2v_get_row_size(1);
  uVar4 = (long)(ulong)(uint)(local_6c * iVar2) * 4 + 0xfU & 0xfffffffffffffff0;
  colbuf_mat.e = (m2v_base *)(ulong)(uint)(local_6c * iVar2);
  *(undefined8 *)(puVar3 + (-8 - uVar4)) = 0x10236c;
  m2v_make(*(int *)(puVar3 + (0x1c - uVar4)),*(int *)(puVar3 + (0x18 - uVar4)),
           *(m2v_base **)(puVar3 + (0x10 - uVar4)));
  for (e_next = 0; e_next < M->n_col; e_next = e_next + 1) {
    if (local_68[e_next] == '\0') {
      if (colperm[e_next] == e_next) {
        local_68[e_next] = 1;
      }
      else {
        *(undefined8 *)(puVar3 + (-8 - uVar4)) = 0x1023c9;
        m2v_copy_col(*(m2v **)(puVar3 + (0x38 - uVar4)),*(int *)(puVar3 + (0x34 - uVar4)),
                     *(m2v **)(puVar3 + (0x28 - uVar4)),*(int *)(puVar3 + (0x24 - uVar4)));
        aiStack_60[2] = e_next;
        for (aiStack_60[1] = colperm[e_next]; aiStack_60[1] != e_next;
            aiStack_60[1] = colperm[aiStack_60[1]]) {
          local_68[aiStack_60[1]] = 1;
          *(undefined8 *)(puVar3 + (-8 - uVar4)) = 0x102404;
          m2v_copy_col(*(m2v **)(puVar3 + (0x38 - uVar4)),*(int *)(puVar3 + (0x34 - uVar4)),
                       *(m2v **)(puVar3 + (0x28 - uVar4)),*(int *)(puVar3 + (0x24 - uVar4)));
          aiStack_60[2] = aiStack_60[1];
        }
        local_68[e_next] = 1;
        *(undefined8 *)(puVar3 + (-8 - uVar4)) = 0x102438;
        m2v_copy_col(*(m2v **)(puVar3 + (0x38 - uVar4)),*(int *)(puVar3 + (0x34 - uVar4)),
                     *(m2v **)(puVar3 + (0x28 - uVar4)),*(int *)(puVar3 + (0x24 - uVar4)));
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}